

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O2

void tcmalloc::SaveProcSelfMapsToRawFD(RawFD fd)

{
  undefined1 local_2040 [8];
  RawFDGenericWriter<8192> writer;
  
  writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.super_GenericWriter.buf_end_ =
       writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.static_buffer_ + 0x1ff8;
  writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.super_GenericWriter.buf_fill_ =
       (char *)0x0;
  writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.super_GenericWriter._vptr_GenericWriter =
       (_func_int **)0x0;
  writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.super_GenericWriter.buf_ = (char *)0x0;
  local_2040 = (undefined1  [8])&PTR__WriteFnWriter_00140f78;
  writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.static_buffer_._8184_4_ = fd;
  SaveProcSelfMaps((GenericWriter *)local_2040);
  WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>::~WriteFnWriter
            ((WriteFnWriter<tcmalloc::RawFDWriteFn,_8192> *)local_2040);
  return;
}

Assistant:

void SaveProcSelfMapsToRawFD(RawFD fd) {
  RawFDGenericWriter<> writer(fd);
  SaveProcSelfMaps(&writer);
}